

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_Surface::IsTorus(ON_Surface *this,ON_Torus *torus,double tolerance)

{
  double dVar1;
  double dVar2;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint test_point;
  ON_3dPoint test_point_00;
  ON_3dPoint test_point_01;
  ON_3dPoint test_point_02;
  ON_3dPoint test_point_03;
  ON_3dPoint test_point_04;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ON_Plane *pOVar14;
  ON_Arc *pOVar15;
  ON_Torus *pOVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar20;
  double extraout_XMM1_Qa;
  double dVar21;
  double dVar22;
  ulong uVar23;
  uint local_338;
  ON_3dPoint P;
  double local_310;
  double local_308;
  ON_3dPoint local_300;
  ON_3dPoint T;
  ON_Torus tr1;
  ON_Torus tr0;
  ON_Arc arc1;
  ON_Arc arc0;
  long *plVar10;
  
  bVar19 = 0;
  bVar3 = ON_IsValid(tolerance);
  dVar20 = tolerance;
  if (!bVar3) {
    dVar20 = 2.3283064365386963e-10;
  }
  dVar21 = dVar20;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  arc0.super_ON_Circle.plane.origin.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  arc0.super_ON_Circle.plane.origin.y = dVar21;
  dVar21 = ON_Interval::Mid((ON_Interval *)&arc0);
  iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar21,0),this,0)
  ;
  plVar10 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar10 == (long *)0x0) {
    return false;
  }
  uVar23 = (ulong)dVar20 & -(ulong)(0.0 < tolerance);
  dVar20 = (double)(~-(ulong)(0.0 < tolerance) & 0x3df0000000000000 | uVar23);
  pOVar14 = &ON_Plane::World_xy;
  pOVar15 = &arc0;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pOVar15->super_ON_Circle).plane.origin.x = (pOVar14->origin).x;
    pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
  }
  arc0.super_ON_Circle.radius = 1.0;
  arc0.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  arc0.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  uVar13 = (uint)uVar23;
  local_338 = -(uint)(2.3283064365386963e-10 < dVar20) & uVar13;
  cVar4 = (**(code **)(*plVar10 + 0x180))(plVar10,0);
  (**(code **)(*plVar10 + 0x20))(plVar10);
  if (cVar4 != '\0') {
    dVar21 = extraout_XMM1_Qa;
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    arc1.super_ON_Circle.plane.origin.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    arc1.super_ON_Circle.plane.origin.y = dVar21;
    dVar21 = ON_Interval::Mid((ON_Interval *)&arc1);
    iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar21,0),this,1);
    plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
    if (plVar10 != (long *)0x0) {
      pOVar14 = &ON_Plane::World_xy;
      pOVar15 = &arc1;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pOVar15->super_ON_Circle).plane.origin.x = (pOVar14->origin).x;
        pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar19 * -2 + 1) * 8);
        pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
      }
      arc1.super_ON_Circle.radius = 1.0;
      arc1.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
      arc1.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
      cVar4 = (**(code **)(*plVar10 + 0x180))(local_338,plVar10,0);
      (**(code **)(*plVar10 + 0x20))(plVar10);
      if (cVar4 == '\0') {
        bVar3 = false;
      }
      else {
        dVar21 = arc0.super_ON_Circle.radius + arc1.super_ON_Circle.radius;
        ON_Torus::ON_Torus(&tr0);
        pOVar15 = &arc0;
        pOVar16 = &tr0;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pOVar16->plane).origin.x = (pOVar15->super_ON_Circle).plane.origin.x;
          pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
          pOVar16 = (ON_Torus *)((long)pOVar16 + (ulong)bVar19 * -0x10 + 8);
        }
        P_00.y = arc1.super_ON_Circle.plane.origin.y;
        P_00.x = arc1.super_ON_Circle.plane.origin.x;
        P_00.z = arc1.super_ON_Circle.plane.origin.z;
        dVar22 = ON_PlaneEquation::ValueAt(&tr0.plane.plane_equation,P_00);
        ::operator*((ON_3dVector *)&P,dVar22,&tr0.plane.zaxis);
        ON_3dPoint::operator+((ON_3dPoint *)&tr1,(ON_3dPoint *)&tr0,(ON_3dVector *)&P);
        tr0.plane.origin.z = tr1.plane.origin.z;
        tr0.plane.origin.x = tr1.plane.origin.x;
        tr0.plane.origin.y = tr1.plane.origin.y;
        ON_Plane::UpdateEquation(&tr0.plane);
        tr0.major_radius = ON_3dPoint::DistanceTo((ON_3dPoint *)&tr0,(ON_3dPoint *)&arc1);
        tr0.minor_radius = arc1.super_ON_Circle.radius;
        ON_Torus::ON_Torus(&tr1);
        pOVar15 = &arc1;
        pOVar16 = &tr1;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pOVar16->plane).origin.x = (pOVar15->super_ON_Circle).plane.origin.x;
          pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
          pOVar16 = (ON_Torus *)((long)pOVar16 + (ulong)bVar19 * -0x10 + 8);
        }
        P_01.y = arc0.super_ON_Circle.plane.origin.y;
        P_01.x = arc0.super_ON_Circle.plane.origin.x;
        P_01.z = arc0.super_ON_Circle.plane.origin.z;
        dVar22 = ON_PlaneEquation::ValueAt(&tr1.plane.plane_equation,P_01);
        ::operator*((ON_3dVector *)&T,dVar22,&tr1.plane.zaxis);
        ON_3dPoint::operator+(&P,(ON_3dPoint *)&tr1,(ON_3dVector *)&T);
        tr1.plane.origin.z = P.z;
        tr1.plane.origin.x = P.x;
        tr1.plane.origin.y = P.y;
        ON_Plane::UpdateEquation(&tr1.plane);
        tr1.major_radius = ON_3dPoint::DistanceTo((ON_3dPoint *)&tr1,(ON_3dPoint *)&arc0);
        tr1.minor_radius = arc0.super_ON_Circle.radius;
        bVar5 = ON_Torus::IsValid(&tr0,(ON_TextLog *)0x0);
        bVar6 = ON_Torus::IsValid(&tr1,(ON_TextLog *)0x0);
        if (bVar5 || bVar6) {
          dVar21 = dVar21 * 7.450580596925e-09;
          local_308 = 0.0;
          local_310 = 0.0;
          for (dVar22 = 0.0; dVar22 < 1.0; dVar22 = dVar22 + 0.25) {
            dVar1 = (dVar22 + dVar22) * 3.141592653589793;
            ON_Circle::PointAt(&local_300,&arc0.super_ON_Circle,dVar1);
            P.z = local_300.z;
            P.x = local_300.x;
            P.y = local_300.y;
            if (bVar5 != false) {
              test_point.y = local_300.y;
              test_point.x = local_300.x;
              test_point.z = local_300.z;
              ON_Torus::ClosestPointTo(&local_300,&tr0,test_point);
              T.z = local_300.z;
              T.x = local_300.x;
              T.y = local_300.y;
              dVar2 = ON_3dPoint::DistanceTo(&T,&P);
              if (dVar2 <= dVar21) {
                if (local_308 < dVar2) {
                  local_308 = dVar2;
                }
              }
              else {
                bVar5 = false;
                bVar3 = false;
                if (bVar6 == false) goto LAB_005aee7b;
              }
            }
            if (bVar6 != false) {
              test_point_00.y = P.y;
              test_point_00.x = P.x;
              test_point_00.z = P.z;
              ON_Torus::ClosestPointTo(&local_300,&tr1,test_point_00);
              T.z = local_300.z;
              T.x = local_300.x;
              T.y = local_300.y;
              dVar2 = ON_3dPoint::DistanceTo(&T,&P);
              if (dVar2 <= dVar21) {
                if (local_310 < dVar2) {
                  local_310 = dVar2;
                }
              }
              else {
                bVar6 = false;
                bVar3 = false;
                if (bVar5 == false) goto LAB_005aee7b;
              }
            }
            ON_Circle::PointAt(&local_300,&arc1.super_ON_Circle,dVar1);
            P.z = local_300.z;
            P.x = local_300.x;
            P.y = local_300.y;
            if (bVar5 != false) {
              test_point_01.y = local_300.y;
              test_point_01.x = local_300.x;
              test_point_01.z = local_300.z;
              ON_Torus::ClosestPointTo(&local_300,&tr0,test_point_01);
              T.z = local_300.z;
              T.x = local_300.x;
              T.y = local_300.y;
              dVar1 = ON_3dPoint::DistanceTo(&T,&P);
              if (dVar1 <= dVar21) {
                if (local_308 < dVar1) {
                  local_308 = dVar1;
                }
              }
              else {
                bVar5 = false;
                bVar3 = false;
                if (bVar6 == false) goto LAB_005aee7b;
              }
            }
            if (bVar6 != false) {
              test_point_02.y = P.y;
              test_point_02.x = P.x;
              test_point_02.z = P.z;
              ON_Torus::ClosestPointTo(&local_300,&tr1,test_point_02);
              T.z = local_300.z;
              T.x = local_300.x;
              T.y = local_300.y;
              dVar1 = ON_3dPoint::DistanceTo(&T,&P);
              if (dVar1 <= dVar21) {
                if (local_310 < dVar1) {
                  local_310 = dVar1;
                }
              }
              else {
                bVar6 = false;
                bVar3 = false;
                if (bVar5 == false) goto LAB_005aee7b;
              }
            }
          }
          if ((bVar5 == false) && (bVar6 == false)) goto LAB_005aee79;
          uVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
          uVar9 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
          memblock = onmalloc((long)(int)(uVar8 + uVar9 + 2) << 3);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,memblock);
          lVar11 = (long)memblock + (long)(int)uVar8 * 8 + 8;
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1,lVar11);
          dVar22 = (double)CONCAT44((int)((ulong)dVar20 >> 0x20),uVar13);
          if (dVar20 <= dVar21) {
            dVar22 = dVar21;
          }
          uVar12 = 0;
          uVar23 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar23 = uVar12;
          }
          uVar18 = (ulong)uVar8;
          if ((int)uVar8 < 1) {
            uVar18 = uVar12;
          }
          for (; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            for (uVar13 = (uint)(uVar12 != 0); uVar13 != 5; uVar13 = uVar13 + 1) {
              dVar20 = *(double *)((long)memblock + uVar12 * 8 + 8);
              dVar21 = *(double *)((long)memblock + uVar12 * 8);
              for (uVar17 = 0; uVar17 != uVar23; uVar17 = uVar17 + 1) {
                iVar7 = 4 - (uint)(uVar17 != 0);
                for (uVar9 = (uint)(uVar17 != 0); uVar9 != 5; uVar9 = uVar9 + 1) {
                  PointAt(&local_300,this,
                          ((double)(int)(4 - uVar13) * dVar21 + (double)(int)uVar13 * dVar20) * 0.25
                          ,((double)iVar7 * *(double *)(lVar11 + uVar17 * 8) +
                           (double)(int)uVar9 *
                           *(double *)((long)memblock + uVar17 * 8 + (long)(int)uVar8 * 8 + 0x10)) *
                           0.25);
                  P.z = local_300.z;
                  P.x = local_300.x;
                  P.y = local_300.y;
                  if (bVar5 != false) {
                    test_point_03.y = local_300.y;
                    test_point_03.x = local_300.x;
                    test_point_03.z = local_300.z;
                    ON_Torus::ClosestPointTo(&local_300,&tr0,test_point_03);
                    T.z = local_300.z;
                    T.x = local_300.x;
                    T.y = local_300.y;
                    dVar1 = ON_3dPoint::DistanceTo(&T,&P);
                    if (dVar1 <= dVar22) {
                      if (local_308 < dVar1) {
                        local_308 = dVar1;
                      }
                      goto LAB_005aedb2;
                    }
                    if (bVar6 != false) {
                      bVar5 = false;
                      goto LAB_005aedb2;
                    }
LAB_005aee6c:
                    onfree(memblock);
                    goto LAB_005aee79;
                  }
LAB_005aedb2:
                  if (bVar6 != false) {
                    test_point_04.y = P.y;
                    test_point_04.x = P.x;
                    test_point_04.z = P.z;
                    ON_Torus::ClosestPointTo(&local_300,&tr1,test_point_04);
                    T.z = local_300.z;
                    T.x = local_300.x;
                    T.y = local_300.y;
                    dVar1 = ON_3dPoint::DistanceTo(&T,&P);
                    if (dVar1 <= dVar22) {
                      if (local_310 < dVar1) {
                        local_310 = dVar1;
                      }
                    }
                    else {
                      if (bVar5 == false) goto LAB_005aee6c;
                      bVar6 = false;
                    }
                  }
                  iVar7 = iVar7 + -1;
                }
              }
            }
          }
          onfree(memblock);
          bVar3 = (bool)(bVar5 | bVar6);
          if ((torus != (ON_Torus *)0x0) && (bVar5 != false || bVar6 != false)) {
            pOVar16 = &tr0;
            if (local_310 < local_308) {
              pOVar16 = &tr1;
            }
            if (bVar6 == false) {
              pOVar16 = &tr0;
            }
            if (bVar5 == false) {
              pOVar16 = &tr1;
            }
            memcpy(torus,pOVar16,0x90);
            bVar3 = true;
          }
        }
        else {
LAB_005aee79:
          bVar3 = false;
        }
LAB_005aee7b:
        ON_Torus::~ON_Torus(&tr1);
        ON_Torus::~ON_Torus(&tr0);
      }
      ON_Plane::~ON_Plane((ON_Plane *)&arc1);
      goto LAB_005aeea2;
    }
  }
  bVar3 = false;
LAB_005aeea2:
  ON_Plane::~ON_Plane((ON_Plane *)&arc0);
  return bVar3;
}

Assistant:

bool ON_Surface::IsTorus( ON_Torus* torus, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_Torus tr0;
  tr0.plane = arc0.plane;
  double h = tr0.plane.plane_equation.ValueAt(arc1.plane.origin);
  tr0.plane.origin = tr0.plane.origin + h*tr0.plane.zaxis;
  tr0.plane.UpdateEquation();
  tr0.major_radius = tr0.plane.origin.DistanceTo(arc1.plane.origin);
  tr0.minor_radius = arc1.radius;

  ON_Torus tr1;
  tr1.plane = arc1.plane;
  h = tr1.plane.plane_equation.ValueAt(arc0.plane.origin);
  tr1.plane.origin = tr1.plane.origin + h*tr1.plane.zaxis;
  tr1.plane.UpdateEquation();
  tr1.major_radius = tr1.plane.origin.DistanceTo(arc0.plane.origin);
  tr1.minor_radius = arc0.radius;

  bool bTestTorus0 = tr0.IsValid()?true:false;
  bool bTestTorus1 = tr1.IsValid()?true:false;
  if ( !bTestTorus0 && !bTestTorus1 )
    return false;
  double tr0tol = 0.0;
  double tr1tol = 0.0;

  ON_3dPoint P, T;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }
  }
  // If the arc's planes are perpendicular, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestTorus0 && !bTestTorus1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestTorus0 )
          {
            T = tr0.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus0 = false;
              if ( !bTestTorus1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr0tol )
              tr0tol = d;
          }
          if ( bTestTorus1 )
          {
            T = tr1.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus1 = false;
              if ( !bTestTorus0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr1tol )
              tr1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestTorus0 || bTestTorus1);
  if ( rc && torus )
  {
    if (!bTestTorus0)
      *torus = tr1;
    else if (!bTestTorus1)
      *torus = tr0;
    else if (tr0tol <= tr1tol)
      *torus = tr0;
    else
      *torus = tr1;
  }

  return rc;
}